

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O0

void unescape_term_string(Term *t)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  size_t sVar5;
  int local_30;
  int iStack_2c;
  char saved_c;
  int base;
  int length;
  char *ss;
  char *start;
  char *s;
  Term *t_local;
  
  ss = (char *)0x0;
  local_30 = 0;
  _base = t->string;
  start = _base;
  do {
    if (*start == '\0') {
      *_base = '\0';
      sVar5 = strlen(t->string);
      t->string_len = (int)sVar5;
      if (t->string_len == 0) {
        d_fail("empty string after unescape \'%s\'",t->string);
      }
      return;
    }
    if (*start != '\\') {
      *_base = *start;
      goto LAB_0013d4e4;
    }
    switch(start[1]) {
    case '\"':
      if (t->kind != TERM_REGEX) goto switchD_0013d0d4_caseD_23;
      *_base = '\"';
      start = start + 1;
      break;
    default:
      goto switchD_0013d0d4_caseD_23;
    case '\'':
      if (t->kind != TERM_STRING) goto switchD_0013d0d4_caseD_23;
      *_base = '\'';
      start = start + 1;
      break;
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
      iStack_2c = 1;
      local_30 = 8;
      ss = start + 1;
      ppuVar3 = __ctype_b_loc();
      iVar2 = iStack_2c;
      if (((((*ppuVar3)[(int)(uint)(byte)start[2]] & 0x800) != 0) && (start[2] != '8')) &&
         (start[2] != '9')) {
        iStack_2c = 2;
        ppuVar3 = __ctype_b_loc();
        iVar2 = 2;
        if (((((*ppuVar3)[(int)(uint)(byte)start[3]] & 0x800) != 0) &&
            (iVar2 = iStack_2c, start[3] != '8')) && (start[3] != '9')) {
          iVar2 = 3;
        }
      }
      iStack_2c = iVar2;
      start = start + iStack_2c;
      goto LAB_0013d434;
    case '\\':
      if (t->kind != TERM_STRING) goto switchD_0013d0d4_caseD_23;
      *_base = '\\';
      start = start + 1;
      break;
    case 'a':
      *_base = '\a';
      start = start + 1;
      break;
    case 'b':
      *_base = '\b';
      start = start + 1;
      break;
    case 'c':
      *_base = '\0';
      return;
    case 'd':
      iStack_2c = 0;
      ppuVar3 = __ctype_b_loc();
      iVar2 = iStack_2c;
      if (((*ppuVar3)[(int)(uint)(byte)start[2]] & 0x800) != 0) {
        local_30 = 10;
        ss = start + 2;
        ppuVar3 = __ctype_b_loc();
        iVar2 = 1;
        if (((*ppuVar3)[(int)(uint)(byte)start[3]] & 0x800) != 0) {
          iStack_2c = 2;
          ppuVar3 = __ctype_b_loc();
          iVar2 = 2;
          if ((((*ppuVar3)[(int)(uint)(byte)start[4]] & 0x800) != 0) &&
             ((start[2] < '2' ||
              ((start[2] == '2' &&
               ((start[3] < '5' || ((iVar2 = iStack_2c, start[3] == '5' && (start[4] < '6'))))))))))
          {
            iVar2 = 3;
          }
        }
      }
      iStack_2c = iVar2;
      start = start + (iStack_2c + 1);
      goto LAB_0013d434;
    case 'f':
      *_base = '\f';
      start = start + 1;
      break;
    case 'n':
      *_base = '\n';
      start = start + 1;
      break;
    case 'r':
      *_base = '\r';
      start = start + 1;
      break;
    case 't':
      *_base = '\t';
      start = start + 1;
      break;
    case 'v':
      *_base = '\v';
      start = start + 1;
      break;
    case 'x':
      iStack_2c = 0;
      ppuVar3 = __ctype_b_loc();
      if (((*ppuVar3)[(int)(uint)(byte)start[2]] & 0x1000) != 0) {
        local_30 = 0x10;
        ss = start + 2;
        iStack_2c = 1;
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)(uint)(byte)start[3]] & 0x1000) != 0) {
          iStack_2c = 2;
        }
      }
      start = start + (iStack_2c + 1);
LAB_0013d434:
      if (iStack_2c != 0) {
        cVar1 = ss[iStack_2c];
        ss[iStack_2c] = '\0';
        lVar4 = strtol(ss,(char **)0x0,local_30);
        *_base = (char)lVar4;
        ss[iStack_2c] = cVar1;
        if (*start < '\x01') {
          d_fail("encountered an escaped NULL while processing \'%s\'",t->string);
switchD_0013d0d4_caseD_23:
          *_base = *start;
          _base[1] = start[1];
          start = start + 1;
          _base = _base + 1;
        }
        break;
      }
      goto LAB_0013d4f0;
    }
LAB_0013d4e4:
    _base = _base + 1;
LAB_0013d4f0:
    start = start + 1;
  } while( true );
}

Assistant:

static void unescape_term_string(Term *t) {
  char *s, *start = 0, *ss;
  int length, base = 0;

  for (ss = s = t->string; *s; s++) {
    if (*s == '\\') {
      switch (s[1]) {
        case '\\':
          if (t->kind == TERM_STRING) {
            *ss = '\\';
            s++;
            break;
          } else
            goto Ldefault;
        case 'b':
          *ss = '\b';
          s++;
          break;
        case 'f':
          *ss = '\f';
          s++;
          break;
        case 'n':
          *ss = '\n';
          s++;
          break;
        case 'r':
          *ss = '\r';
          s++;
          break;
        case 't':
          *ss = '\t';
          s++;
          break;
        case 'v':
          *ss = '\v';
          s++;
          break;
        case 'a':
          *ss = '\a';
          s++;
          break;
        case 'c':
          *ss = 0;
          return;
        case '\"':
          if (t->kind == TERM_REGEX) {
            *ss = '\"';
            s++;
            break;
          } else
            goto Ldefault;
        case '\'':
          if (t->kind == TERM_STRING) {
            *ss = '\'';
            s++;
            break;
          } else
            goto Ldefault;
        case 'x':
          length = 0;
          if (isxdigit_(s[2])) {
            base = 16;
            start = s + 2;
            length++;
            if (isxdigit_(s[3])) length++;
          }
          s += length + 1;
          goto Lncont;
        case 'd':
          length = 0;
          if (isdigit_(s[2])) {
            base = 10;
            start = s + 2;
            length++;
            if (isdigit_(s[3])) {
              length++;
              if (isdigit_(s[4]) &&
                  ((s[2] < '2') || ((s[2] == '2') && ((s[3] < '5') || ((s[3] == '5') && (s[4] < '6'))))))
                length++;
            }
          }
          s += length + 1;
          goto Lncont;
        case '0':
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
        case '7':
          length = 1;
          base = 8;
          start = s + 1;
          if (isdigit_(s[2]) && (s[2] != '8') && (s[2] != '9')) {
            length++;
            if (isdigit_(s[3]) && (s[3] != '8') && (s[3] != '9')) {
              length++;
            }
          }
          s += length;
          /* fall through */
        Lncont:
          if (length > 0) {
            char saved_c = start[length];
            start[length] = '\0';
            *ss = (unsigned char)strtol(start, NULL, base);
            start[length] = saved_c;
            if (*s > 0) break;
            d_fail("encountered an escaped NULL while processing '%s'", t->string);
          } else
            goto next;
        Ldefault:
        default:
          *ss++ = *s;
          *ss = s[1];
          s++;
          break;
      }
    } else
      *ss = *s;
    ss++;
  next:;
  }
  *ss = 0;
  t->string_len = strlen(t->string);
  if (!t->string_len) d_fail("empty string after unescape '%s'", t->string);
}